

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int francis_iter(double *A,int N,double *H)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *A_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  double *pdVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar6;
  
  lVar22 = (long)N;
  A_00 = (double *)malloc(lVar22 * lVar22 * 8);
  uVar6 = (ulong)(N - 1);
  if (N == 0) {
    hessenberg(H,0);
    iVar14 = 0;
  }
  else {
    uVar8 = 0;
    do {
      H[uVar8] = A[uVar8];
      uVar8 = uVar8 + 1;
    } while (N * N + (uint)(N * N == 0) != uVar8);
    hessenberg(H,N);
    iVar14 = 0;
    if (2 < N) {
      iVar19 = N + 1;
      lVar1 = lVar22 * 8 + 8;
      iVar14 = 0;
LAB_001205b4:
      do {
        iVar3 = (int)uVar6;
        uVar11 = iVar3 - 1;
        if ((H[(long)(iVar3 * iVar19) + -1] != 0.0) || (NAN(H[(long)(iVar3 * iVar19) + -1]))) {
          if ((H[(long)(int)(uVar11 * N + iVar3) + -2] == 0.0) &&
             (!NAN(H[(long)(int)(uVar11 * N + iVar3) + -2]))) {
            uVar11 = iVar3 - 2;
            goto LAB_001205ec;
          }
        }
        else {
LAB_001205ec:
          uVar6 = (ulong)uVar11;
          if (1 < (int)uVar11) goto LAB_001205b4;
        }
        iVar3 = (int)uVar6;
        if (iVar3 < 1) break;
        iVar4 = (iVar3 + -1) * iVar19;
        uVar9 = uVar6;
        uVar8 = uVar6;
        do {
          uVar20 = uVar8;
          iVar21 = (int)uVar9;
          if (uVar20 < 2) {
            uVar8 = 0;
            iVar4 = 1;
            goto LAB_00120647;
          }
          uVar8 = uVar20 - 1;
          lVar7 = (long)iVar4;
          iVar4 = iVar4 + ~N;
          uVar9 = (ulong)(iVar21 - 1);
        } while ((H[lVar7 + -1] != 0.0) || (NAN(H[lVar7 + -1])));
        iVar4 = (int)uVar8 + 1;
LAB_00120647:
        uVar11 = (uint)uVar8;
        iVar17 = (int)uVar20;
        if (iVar3 < (int)uVar11) {
          francisQR(A_00,(iVar3 - uVar11) + 1);
        }
        else {
          iVar5 = (iVar3 - iVar4) + 2;
          iVar18 = iVar21 + (uint)(iVar21 == 0);
          pdVar16 = (double *)(lVar1 * (iVar18 + -1) + (long)H);
          lVar12 = (long)(iVar18 + -1) + -1;
          iVar18 = (iVar18 + ~uVar11) * iVar5 + (iVar18 - iVar4);
          lVar7 = lVar12;
          iVar13 = iVar18;
          pdVar15 = pdVar16;
          lVar10 = (long)(int)(iVar17 + -1 + (uint)(iVar17 == 0));
          do {
            do {
              A_00[iVar18] = *pdVar16;
              pdVar16 = pdVar16 + 1;
              lVar7 = lVar7 + 1;
              iVar18 = iVar18 + 1;
            } while (lVar7 < (long)uVar6);
            pdVar16 = pdVar15 + lVar22;
            iVar18 = iVar13 + iVar5;
            bVar2 = lVar10 < (long)uVar6;
            lVar7 = lVar12;
            iVar13 = iVar18;
            pdVar15 = pdVar16;
            lVar10 = lVar10 + 1;
          } while (bVar2);
          iVar18 = (iVar3 - uVar11) + 1;
          francisQR(A_00,iVar18);
          if ((int)uVar11 <= iVar3) {
            iVar13 = iVar21 + (uint)(iVar21 == 0);
            pdVar16 = (double *)(lVar1 * (iVar13 + -1) + (long)H);
            lVar12 = (long)(iVar13 + -1) + -1;
            iVar13 = (~uVar11 + iVar13) * iVar18 + (iVar13 - iVar4);
            lVar7 = lVar12;
            iVar5 = iVar13;
            pdVar15 = pdVar16;
            lVar10 = (long)(int)(iVar17 + -1 + (uint)(iVar17 == 0));
            do {
              do {
                *pdVar16 = A_00[iVar13];
                pdVar16 = pdVar16 + 1;
                lVar7 = lVar7 + 1;
                iVar13 = iVar13 + 1;
              } while (lVar7 < (long)uVar6);
              pdVar16 = pdVar15 + lVar22;
              iVar13 = iVar5 + iVar18;
              bVar2 = lVar10 < (long)uVar6;
              lVar7 = lVar12;
              iVar5 = iVar13;
              pdVar15 = pdVar16;
              lVar10 = lVar10 + 1;
            } while (bVar2);
          }
        }
        if (iVar4 <= iVar3) {
          lVar7 = (long)(int)(iVar17 + -1 + (uint)(iVar17 == 0));
          iVar21 = iVar21 + (uint)(iVar21 == 0);
          iVar4 = iVar21 + -1;
          pdVar16 = H + iVar4;
          iVar21 = iVar21 * N;
          pdVar15 = H + (long)iVar4 + 1;
          iVar4 = iVar4 * iVar19;
          do {
            if (ABS(pdVar16[iVar21]) <= (ABS(pdVar15[iVar21]) + ABS(H[iVar4])) * 1e-12) {
              pdVar16[iVar21] = 0.0;
            }
            lVar7 = lVar7 + 1;
            pdVar16 = pdVar16 + 1;
            iVar21 = iVar21 + N;
            pdVar15 = pdVar15 + 1;
            iVar4 = iVar4 + iVar19;
          } while (lVar7 < (long)uVar6);
        }
        iVar14 = iVar14 + 1;
        if ((iVar3 == 1) || (N * 0x1e <= iVar14)) break;
      } while( true );
    }
  }
  free(A_00);
  return (int)(iVar14 != N * 0x1e);
}

Assistant:

int francis_iter(double *A, int N, double *H) {
	int success,brkpoint;
	int i,j,it,p,q,t,u;
	double *temp;
	success = 0;
	brkpoint = 30 * N;
	it = 0;
	p = N - 1;
	temp = (double*) malloc(sizeof(double) * N * N);
	for(i = 0; i < N*N;++i) {
		H[i] = A[i];
	}
	
	hessenberg(H,N);
	
	while (p > 1 && it < brkpoint) {
		
		while (p > 1 && (H[N*p + p-1] == 0 || H[N*(p-1) + p-2] == 0)) {
			if (H[N*p + p-1] == 0) {
				p--;
			} else if (H[N*(p-1) + p-2] == 0) {
				p=p-2;
			}
		}
		
		if (p > 0) {
			q = p-1;
			while (q > 0 && fabs(H[N*q + q-1]) != 0) {
				q--;
			}
			//printf("%d %d \n",q,p);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					temp[u+j-q] = H[t+j];
				}
			}
			francisQR(temp,p-q+1);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					H[t+j] = temp[u+j-q];
				}
			}
			//mdisplay(H,N,N);
			for(i = q; i <= p-1;++i) {
				if ( fabs(H[(i+1)*N+i]) <= TOL * (fabs(H[i*N+i]) + fabs(H[(i+1)*N+i+1]) ) ) {
					H[(i+1)*N+i] = 0.;
				}
			}
			it++;
			//printf("iter %d \n",it);
		}
	}
	
	if (it == brkpoint) {
		success = 0;
	} else {
		success = 1;
	}
	
	free(temp);
	return success;
}